

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

string * __thiscall helics::ActionMessage::getString_abi_cxx11_(ActionMessage *this,int index)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd8;
  const_reference local_8;
  
  bVar1 = isValidIndex<int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd8);
  if (bVar1) {
    local_8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(in_RDI + 0xa0),(long)in_ESI);
  }
  else {
    local_8 = (const_reference)emptyStr_abi_cxx11_;
  }
  return local_8;
}

Assistant:

const std::string& ActionMessage::getString(int index) const
{
    if (isValidIndex(index, stringData)) {
        return stringData[index];
    }
    return emptyStr;
}